

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void registerInput(char *arg)

{
  char *arg_local;
  
  arg_local = arg;
  if (options.input.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>._M_payload.
      super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
      super__Optional_payload_base<std::filesystem::__cxx11::path>._M_engaged) {
    fprintf(_stderr,"FATAL: input image specified more than once! (first \"%s\", then \"%s\")\n",
            options.input.super__Optional_base<std::filesystem::__cxx11::path,_false,_false>.
            _M_payload.super__Optional_payload<std::filesystem::__cxx11::path,_true,_false,_false>.
            super__Optional_payload_base<std::filesystem::__cxx11::path>._M_payload._M_value.
            _M_pathname._M_dataplus._M_p);
  }
  else {
    if (*arg != '\0') {
      std::optional<std::filesystem::__cxx11::path>::emplace<char_const*&>
                (&options.input,&arg_local);
      return;
    }
    fwrite("FATAL: input image path cannot be empty\n",0x28,1,_stderr);
  }
  printUsage();
  exit(1);
}

Assistant:

static void registerInput(char const *arg) {
	if (options.input.has_value()) {
		fprintf(stderr,
		        "FATAL: input image specified more than once! (first \"%s\", then "
		        "\"%s\")\n",
		        options.input->c_str(), arg);
		printUsage();
		exit(1);
	} else if (arg[0] == '\0') { // Empty input path
		fprintf(stderr, "FATAL: input image path cannot be empty\n");
		printUsage();
		exit(1);
	} else {
		options.input.emplace(arg);
	}
}